

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.h
# Opt level: O2

void __thiscall SQFuncState::AddDefaultParam(SQFuncState *this,SQInteger trg)

{
  SQInteger local_8;
  
  local_8 = trg;
  sqvector<long_long>::push_back(&this->_defaultparams,&local_8);
  return;
}

Assistant:

void AddDefaultParam(SQInteger trg) { _defaultparams.push_back(trg); }